

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialogPrivate::renameCurrent(QFileDialogPrivate *this)

{
  QFileDialog *this_00;
  ViewMode VVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 *local_58;
  undefined1 *puStack_50;
  QAbstractItemModel *local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialog **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  local_28.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
  QAbstractItemView::currentIndex
            ((QModelIndex *)&local_38,(QAbstractItemView *)((this->qFileDialogUi).d)->listView);
  if (local_28.ptr == (QAbstractItemModel *)0x0) {
    local_58 = (undefined1 *)0xffffffffffffffff;
    puStack_50 = (undefined1 *)0x0;
    local_48 = (QAbstractItemModel *)0x0;
  }
  else if (local_38._4_4_ == 0) {
    local_48 = local_28.ptr;
    local_58 = local_38;
    puStack_50 = puStack_30;
  }
  else {
    (**(code **)(*(long *)local_28.ptr + 0x70))
              (&local_58,local_28.ptr,(ulong)local_38 & 0xffffffff,0);
  }
  local_28.ptr = local_48;
  local_38 = local_58;
  puStack_30 = puStack_50;
  VVar1 = QFileDialog::viewMode(this_00);
  lVar2 = 0xa0;
  if (VVar1 == List) {
    lVar2 = 0x88;
  }
  QAbstractItemView::edit
            (*(QAbstractItemView **)((long)&((this->qFileDialogUi).d)->gridLayout + lVar2),
             (QModelIndex *)&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialogPrivate::renameCurrent()
{
    Q_Q(QFileDialog);
    QModelIndex index = qFileDialogUi->listView->currentIndex();
    index = index.sibling(index.row(), 0);
    if (q->viewMode() == QFileDialog::List)
        qFileDialogUi->listView->edit(index);
    else
        qFileDialogUi->treeView->edit(index);
}